

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O3

int __thiscall glcts::LayoutBindingBaseCase::maxArraySize(LayoutBindingBaseCase *this)

{
  eStageType eVar1;
  uint in_EAX;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar3;
  int units;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  iVar2 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  eVar1 = (this->m_stage).type;
  if (*(int *)(CONCAT44(extraout_var,iVar2) + 8) == 2) {
    if (eVar1 == VertexShader) {
      uVar3 = 0x90ca;
    }
    else {
      if (eVar1 != FragmentShader) goto LAB_00bd86a4;
      uVar3 = 0x90ce;
    }
  }
  else if (eVar1 == VertexShader) {
    uVar3 = 0x8b4c;
  }
  else {
    if (eVar1 != FragmentShader) goto LAB_00bd86a4;
    uVar3 = 0x8872;
  }
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x868))(uVar3,(long)&uStack_18 + 4);
LAB_00bd86a4:
  return uStack_18._4_4_;
}

Assistant:

virtual int maxArraySize()
	{
		int units = 0;

		if (getTestParameters().surface_type == Image)
		{
			switch (m_stage.type)
			{
			case VertexShader:
				gl().getIntegerv(GL_MAX_VERTEX_IMAGE_UNIFORMS, &units);
				break;
			case FragmentShader:
				gl().getIntegerv(GL_MAX_FRAGMENT_IMAGE_UNIFORMS, &units);
				break;
			default:
				DE_ASSERT(0);
				break;
			}
		}
		else
		{
			switch (m_stage.type)
			{
			case VertexShader:
				gl().getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &units);
				break;
			case FragmentShader:
				gl().getIntegerv(GL_MAX_TEXTURE_IMAGE_UNITS, &units);
				break;
			default:
				DE_ASSERT(0);
				break;
			}
		}

		return units;
	}